

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void delta_encode_palette_colors(int *colors,int num,int bit_depth,int min_val,aom_writer *w)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int deltas [8];
  int local_58 [10];
  
  if (0 < num) {
    if (0 < bit_depth) {
      uVar8 = *colors;
      iVar7 = bit_depth + 1;
      do {
        od_ec_encode_bool_q15(&w->ec,(uint)((uVar8 >> (iVar7 - 2U & 0x1f) & 1) != 0),0x4000);
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    if (num != 1) {
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      uVar4 = 2;
      if (2 < num) {
        uVar4 = (ulong)(uint)num;
      }
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      lVar5 = 0;
      iVar7 = 0;
      do {
        iVar1 = colors[lVar5 + 1] - colors[lVar5];
        local_58[lVar5] = iVar1;
        if (iVar1 <= iVar7) {
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        lVar5 = lVar5 + 1;
      } while (uVar4 - 1 != lVar5);
      iVar1 = bit_depth + -3;
      uVar2 = iVar7 - min_val;
      uVar8 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      iVar7 = 0;
      if (1 < (int)(uVar2 + 1)) {
        iVar7 = (uVar8 ^ 0xffffffe0) + 0x21;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      iVar6 = *colors;
      uVar8 = 3;
      do {
        od_ec_encode_bool_q15
                  (&w->ec,(uint)(((uint)(iVar7 - iVar1) >> (uVar8 - 2 & 0x1f) & 1) != 0),0x4000);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
      iVar6 = (1 << ((byte)bit_depth & 0x1f)) - (iVar6 + min_val);
      iVar1 = 2;
      if (2 < num) {
        iVar1 = num;
      }
      uVar4 = 0;
      do {
        iVar3 = local_58[uVar4];
        if (0 < iVar7) {
          iVar9 = iVar7 + 1;
          do {
            od_ec_encode_bool_q15
                      (&w->ec,(uint)(((uint)(iVar3 - min_val) >> (iVar9 - 2U & 0x1f) & 1) != 0),
                       0x4000);
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
        iVar6 = iVar6 - iVar3;
        uVar8 = 0x1f;
        if (iVar6 - 1U != 0) {
          for (; iVar6 - 1U >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        iVar3 = (uVar8 ^ 0xffffffe0) + 0x21;
        if (iVar6 < 2) {
          iVar3 = 0;
        }
        if (iVar3 <= iVar7) {
          iVar7 = iVar3;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != iVar1 - 1);
    }
  }
  return;
}

Assistant:

static inline void delta_encode_palette_colors(const int *colors, int num,
                                               int bit_depth, int min_val,
                                               aom_writer *w) {
  if (num <= 0) return;
  assert(colors[0] < (1 << bit_depth));
  aom_write_literal(w, colors[0], bit_depth);
  if (num == 1) return;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  memset(deltas, 0, sizeof(deltas));
  for (int i = 1; i < num; ++i) {
    assert(colors[i] < (1 << bit_depth));
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  const int min_bits = bit_depth - 3;
  int bits = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  aom_write_literal(w, bits - min_bits, 2);
  for (int i = 0; i < num - 1; ++i) {
    aom_write_literal(w, deltas[i] - min_val, bits);
    range -= deltas[i];
    bits = AOMMIN(bits, av1_ceil_log2(range));
  }
}